

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextReader.cpp
# Opt level: O0

void __thiscall TextFileReader::NextBuffer(TextFileReader *this)

{
  int iVar1;
  size_t sVar2;
  TextFileReader *this_local;
  
  if (this->mGzFile == (gzFile)0x0) {
    sVar2 = read(this->mFd,this->mBuffer,this->mTotalBufferSize);
    this->mBufferSize = sVar2;
  }
  else {
    iVar1 = gzread(this->mGzFile,this->mBuffer,this->mTotalBufferSize & 0xffffffff);
    this->mBufferSize = (long)iVar1;
  }
  this->mBufferPos = 0;
  return;
}

Assistant:

void TextFileReader::NextBuffer() {
#ifdef USE_ZLIB
  if( mGzFile ) {
    mBufferSize = gzread( mGzFile, mBuffer, mTotalBufferSize );
  } else
#endif
  {
    mBufferSize = read( mFd, mBuffer, mTotalBufferSize );
  }

  mBufferPos = 0;
}